

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O1

char * Rwt_ManGetPractical(Rwt_Man_t *p)

{
  int iVar1;
  char *__s;
  long lVar2;
  
  iVar1 = p->nFuncs;
  __s = (char *)malloc((long)iVar1);
  memset(__s,0,(long)iVar1);
  *__s = '\x01';
  lVar2 = 1;
  do {
    __s[s_RwtPracticalClasses[lVar2]] = '\x01';
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x87);
  return __s;
}

Assistant:

char * Rwt_ManGetPractical( Rwt_Man_t * p )
{
    char * pPractical;
    int i;
    pPractical = ABC_ALLOC( char, p->nFuncs );
    memset( pPractical, 0, sizeof(char) * p->nFuncs );
    pPractical[0] = 1;
    for ( i = 1; ; i++ )
    {
        if ( s_RwtPracticalClasses[i] == 0 )
            break;
        pPractical[ s_RwtPracticalClasses[i] ] = 1;
    }
    return pPractical;
}